

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp.c
# Opt level: O1

int getoken(expr *expr,ex_ex *eptr)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  ushort **ppuVar7;
  byte *s;
  anon_union_8_5_735de1bb_for_ex_cont aVar8;
  byte *pbVar9;
  ex_ex ex;
  anon_union_8_5_735de1bb_for_ex_cont local_48;
  long lStack_40;
  ex_ex *local_38;
  
  if (expr->exp_str == (char *)0x0) {
    post("expr: getoken: expression string not set\n");
    return 0;
  }
  pbVar9 = (byte *)expr->exp_str;
switchD_001982fa_caseD_20:
  s = pbVar9;
  if (*s == 0x3b) {
    expr->exp_str = (char *)(s + 1);
LAB_0019833e:
    (eptr->ex_cont).v_int = 0;
    eptr->ex_type = 0;
    goto LAB_00198345;
  }
  if (*s == 0) goto LAB_0019833e;
  eptr->ex_type = 3;
  pbVar9 = s + 1;
  expr->exp_str = (char *)pbVar9;
  bVar1 = *s;
  if (bVar1 < 0x20) goto LAB_001982fc;
  switch(bVar1) {
  case 0x20:
  case 0x5c:
    goto switchD_001982fa_caseD_20;
  case 0x21:
    if (s[1] != 0x3d) {
      (eptr->ex_cont).v_vec = (t_float *)0xe0017;
      goto LAB_00198345;
    }
    (eptr->ex_cont).v_vec = (t_float *)0x90008;
    break;
  case 0x22:
    local_48.v_int = 0;
    lStack_40 = 0;
    local_38 = (ex_ex *)0x0;
    if ((s[1] == 0x22) || (s[1] == 0)) {
      expr->exp_str = (char *)s;
      pcVar6 = "expr: syntax error: empty symbol: %s\n";
      goto LAB_00198837;
    }
    iVar4 = getoken(expr,(ex_ex *)&local_48);
    if (iVar4 != 0) goto LAB_0019883e;
    if (lStack_40 == 0xd) {
      eptr->ex_end = local_38;
      (eptr->ex_cont).ptr = (char *)local_48;
      eptr->ex_type = 0xd;
      lVar5 = 8;
    }
    else {
      if (lStack_40 != 4) {
        s = s + 1;
        pcVar6 = "expr: syntax error: bad symbol name: %s\n";
        goto LAB_00198837;
      }
      iVar4 = ex_getsym(local_48.ptr,(fts_symbol_t *)eptr);
      if (iVar4 != 0) {
        pcVar6 = "expr: syntax error: getoken: problms with ex_getsym\n";
        goto LAB_001984c6;
      }
      lVar5 = 7;
    }
    eptr->ex_type = lVar5;
    pcVar6 = expr->exp_str;
    expr->exp_str = pcVar6 + 1;
    if (*pcVar6 != '\"') {
      pcVar6 = "expr: syntax error: missing \'\"\'\n";
      goto LAB_001984c6;
    }
    goto LAB_00198345;
  case 0x23:
  case 0x27:
  case 0x3a:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
    goto switchD_001982fa_caseD_23;
  case 0x24:
    pbVar9 = s + 2;
    expr->exp_str = (char *)pbVar9;
    bVar1 = s[1];
    lVar5 = 0xb;
    if (bVar1 < 0x53) {
      if (9 < bVar1 - 0x30) {
        if (bVar1 == 0x46) goto LAB_00198768;
        if (bVar1 == 0x49) goto LAB_001987e2;
        goto switchD_00198626_caseD_54;
      }
LAB_00198416:
      pcVar6 = expr->exp_str;
      expr->exp_str = pcVar6 + -1;
      pcVar6 = atoif(pcVar6 + -1,(long *)eptr,&local_48.v_int);
      if (pcVar6 == (char *)0x0) {
        return 1;
      }
      if ((char *)local_48.v_int != (char *)0x1) {
        post("expr: syntax error: %s\n",expr->exp_str);
        return 1;
      }
      expr->exp_str = pcVar6;
      eptr->ex_type = 1;
      (eptr->ex_cont).v_int = 0;
      goto LAB_00198345;
    }
    if (bVar1 < 0x69) {
      switch(bVar1) {
      case 0x53:
        goto switchD_00198626_caseD_53;
      case 0x54:
      case 0x55:
      case 0x57:
        break;
      case 0x56:
        goto switchD_00198626_caseD_56;
      case 0x58:
        goto switchD_00198626_caseD_58;
      case 0x59:
        goto switchD_00198626_caseD_59;
      default:
        if (bVar1 == 0x66) {
LAB_00198768:
          lVar5 = 0xc;
          goto LAB_001987e2;
        }
      }
      goto switchD_00198626_caseD_54;
    }
    switch(bVar1) {
    case 0x73:
switchD_00198626_caseD_53:
      lVar5 = 0xd;
      goto LAB_001987e2;
    case 0x74:
    case 0x75:
    case 0x77:
      goto switchD_00198626_caseD_54;
    case 0x76:
switchD_00198626_caseD_56:
      if ((expr->exp_flags & 5) == 0) {
        lVar5 = 0xe;
        goto LAB_001987e2;
      }
      pcVar6 = "$v? works only for expr~";
LAB_00198757:
      post(pcVar6);
      goto LAB_00198822;
    case 0x78:
switchD_00198626_caseD_58:
      if ((expr->exp_flags & 3) != 0) {
        pcVar6 = "$x? works only for fexpr~";
        goto LAB_00198757;
      }
      eptr->ex_type = 0x12;
      ppuVar7 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar7 + (long)(char)*pbVar9 * 2 + 1) & 8) == 0) {
        (eptr->ex_cont).v_int = 0;
        expr->exp_var[0].ex_type = 0x12;
        goto LAB_00198345;
      }
      break;
    case 0x79:
switchD_00198626_caseD_59:
      if ((expr->exp_flags & 3) != 0) {
        post("$y works only for fexpr~");
        goto LAB_00198416;
      }
      eptr->ex_type = 0x10;
      ppuVar7 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar7 + (long)(char)*pbVar9 * 2 + 1) & 8) == 0) {
        (eptr->ex_cont).v_int = 0;
        expr->exp_var[0].ex_type = 0x10;
        goto LAB_00198345;
      }
      break;
    default:
      if (bVar1 != 0x69) goto switchD_00198626_caseD_54;
LAB_001987e2:
      eptr->ex_type = lVar5;
    }
    pcVar6 = atoif((char *)pbVar9,(long *)eptr,&local_48.v_int);
    if (pcVar6 == (char *)0x0) {
LAB_00198822:
      s = (byte *)(expr->exp_str + -2);
    }
    else {
      if ((char *)local_48.v_int == (char *)0x1) {
        lVar5 = (eptr->ex_cont).v_int;
        if (lVar5 != 0) {
          (eptr->ex_cont).v_vec = (t_float *)(lVar5 + -1);
          if (lVar5 < 0x65) {
            if ((((t_float *)(lVar5 + -1) == (t_float *)0x0) &&
                ((expr->exp_flags & 3U) == 0 || (expr->exp_flags & 5U) == 0)) &&
               (eptr->ex_type - 0xbU < 3)) {
              pcVar6 = "first inlet of expr~/fexpr~ can only be a vector";
              goto LAB_001984c6;
            }
            lVar2 = eptr->ex_type;
            if (lVar2 != 0x10) {
              lVar3 = expr->exp_var[lVar5 + -1].ex_type;
              if (lVar3 == 0) {
                expr->exp_var[lVar5 + -1].ex_type = lVar2;
              }
              else if (lVar3 != lVar2) {
                s = (byte *)expr->exp_str;
                pcVar6 = "expr: syntax error: inlets can only have one type: %s\n";
                goto LAB_00198837;
              }
            }
LAB_00198331:
            expr->exp_str = pcVar6;
            goto LAB_00198345;
          }
        }
        s = (byte *)expr->exp_str;
        pcVar6 = "expr: syntax error: inlet or outlet out of range: %s\n";
        goto LAB_00198837;
      }
      s = (byte *)expr->exp_str;
    }
    pcVar6 = "expr: syntax error: %s\n";
    goto LAB_00198837;
  case 0x25:
    (eptr->ex_cont).v_vec = (t_float *)0xd0012;
    goto LAB_00198345;
  case 0x26:
    if (s[1] == 0x26) {
      expr->exp_str = (char *)(s + 2);
      (eptr->ex_cont).v_vec = (t_float *)0x50004;
    }
    else {
      (eptr->ex_cont).v_vec = (t_float *)0x80007;
    }
    goto LAB_00198345;
  case 0x28:
    (eptr->ex_cont).v_vec = (t_float *)0xf001b;
    goto LAB_00198345;
  case 0x29:
    (eptr->ex_cont).v_vec = (t_float *)0xf001a;
    goto LAB_00198345;
  case 0x2a:
    (eptr->ex_cont).v_vec = (t_float *)0xd0014;
    goto LAB_00198345;
  case 0x2b:
    (eptr->ex_cont).v_vec = (t_float *)0xc0011;
    goto LAB_00198345;
  case 0x2c:
    (eptr->ex_cont).v_vec = (t_float *)0x20002;
    goto LAB_00198345;
  case 0x2d:
    (eptr->ex_cont).v_vec = (t_float *)0xc0010;
    goto LAB_00198345;
  case 0x2e:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    expr->exp_str = (char *)s;
    pcVar6 = atoif((char *)s,(long *)eptr,&eptr->ex_type);
    if (pcVar6 != (char *)0x0) goto LAB_00198331;
    goto LAB_0019883e;
  case 0x2f:
    (eptr->ex_cont).v_vec = (t_float *)0xd0013;
    goto LAB_00198345;
  case 0x3b:
    pcVar6 = "expr: syntax error: \';\' not implemented\n";
LAB_001984c6:
    post(pcVar6);
    goto LAB_0019883e;
  case 0x3c:
    if (s[1] == 0x3d) {
      (eptr->ex_cont).v_vec = (t_float *)0xa000c;
    }
    else {
      if (s[1] != 0x3c) {
        (eptr->ex_cont).v_vec = (t_float *)0xa000d;
        goto LAB_00198345;
      }
      (eptr->ex_cont).v_vec = (t_float *)0xb000f;
    }
    break;
  case 0x3d:
    if (s[1] == 0x3d) {
      expr->exp_str = (char *)(s + 2);
      (eptr->ex_cont).v_vec = (t_float *)0x90009;
    }
    else {
      (eptr->ex_cont).v_vec = (t_float *)0x3001c;
    }
    goto LAB_00198345;
  case 0x3e:
    if (s[1] == 0x3d) {
      (eptr->ex_cont).v_vec = (t_float *)0xa000a;
    }
    else {
      if (s[1] != 0x3e) {
        (eptr->ex_cont).v_vec = (t_float *)0xa000b;
        goto LAB_00198345;
      }
      (eptr->ex_cont).v_vec = (t_float *)0xb000e;
    }
    break;
  case 0x5b:
    (eptr->ex_cont).v_vec = (t_float *)0xf0019;
    goto LAB_00198345;
  case 0x5d:
    (eptr->ex_cont).v_vec = (t_float *)0xf0018;
    goto LAB_00198345;
  case 0x5e:
    (eptr->ex_cont).v_vec = (t_float *)0x70006;
    goto LAB_00198345;
  default:
    if (bVar1 == 0x7c) {
      if (s[1] == 0x7c) {
        expr->exp_str = (char *)(s + 2);
        (eptr->ex_cont).v_vec = (t_float *)0x40003;
      }
      else {
        (eptr->ex_cont).v_vec = (t_float *)0x60005;
      }
      goto LAB_00198345;
    }
    if (bVar1 == 0x7e) {
      (eptr->ex_cont).v_vec = (t_float *)0xe0016;
      goto LAB_00198345;
    }
    goto switchD_001982fa_caseD_23;
  }
  expr->exp_str = expr->exp_str + 1;
  goto LAB_00198345;
LAB_001982fc:
  if (bVar1 != 9) {
switchD_001982fa_caseD_23:
    expr->exp_str = (char *)s;
    bVar1 = *s;
    if ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a))
    {
      aVar8.v_int = 0;
      do {
        do {
          bVar1 = (s + 1)[(long)aVar8.v_vec];
          aVar8.v_vec = (t_float *)(aVar8.v_int + 1);
        } while ((byte)(bVar1 - 0x30) < 10);
      } while ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
      pbVar9 = s + (long)aVar8.v_vec;
    }
    else {
      aVar8.v_int = 0;
      pbVar9 = s;
    }
    local_48 = aVar8;
    if ((char *)aVar8.v_int == (char *)0x0) {
switchD_00198626_caseD_54:
      pcVar6 = "expr: syntax error: %s\n";
LAB_00198837:
      post(pcVar6,s);
LAB_0019883e:
      iVar4 = 1;
    }
    else {
      pcVar6 = (char *)malloc((size_t)(aVar8.v_int + 1));
      (eptr->ex_cont).ptr = pcVar6;
      strncpy(pcVar6,expr->exp_str,(long)(int)aVar8.v_flt);
      pcVar6[aVar8.ptr] = '\0';
      expr->exp_str = (char *)pbVar9;
      eptr->ex_type = 4;
LAB_00198345:
      iVar4 = 0;
    }
    return iVar4;
  }
  goto switchD_001982fa_caseD_20;
}

Assistant:

int
getoken(struct expr *expr, struct ex_ex *eptr)
{
        char *p;
        long i;


        if (!expr->exp_str) {
                post("expr: getoken: expression string not set\n");
                return (0);
        }
retry:
        if (!*expr->exp_str) {
                eptr->ex_type = 0;
                eptr->ex_int = 0;
                return (0);
        }
        if (*expr->exp_str == ';') {
                expr->exp_str++;
                eptr->ex_type = 0;
                eptr->ex_int = 0;
                return (0);
        }
        eptr->ex_type = ET_OP;
        switch (*expr->exp_str++) {
        case '\\':
        case ' ':
        case '\t':
                goto retry;
        case ';':
                post("expr: syntax error: ';' not implemented\n");
                return (1);
        case ',':
                eptr->ex_op = OP_COMMA;
                break;
        case '(':
                eptr->ex_op = OP_LP;
                break;
        case ')':
                eptr->ex_op = OP_RP;
                break;
        case ']':
                eptr->ex_op = OP_RB;
                break;
        case '~':
                eptr->ex_op = OP_NEG;
                break;
                /* we will take care of unary minus later */
        case '*':
                eptr->ex_op = OP_MUL;
                break;
        case '/':
                eptr->ex_op = OP_DIV;
                break;
        case '%':
                eptr->ex_op = OP_MOD;
                break;
        case '+':
                eptr->ex_op = OP_ADD;
                break;
        case '-':
                eptr->ex_op = OP_SUB;
                break;
        case '^':
                eptr->ex_op = OP_XOR;
                break;
        case '[':
                eptr->ex_op = OP_LB;
                break;
        case '!':
                if (*expr->exp_str == '=') {
                        eptr->ex_op = OP_NE;
                        expr->exp_str++;
                } else
                        eptr->ex_op = OP_NOT;
                break;
        case '<':
                switch (*expr->exp_str) {
                case '<':
                        eptr->ex_op = OP_SL;
                        expr->exp_str++;
                        break;
                case '=':
                        eptr->ex_op = OP_LE;
                        expr->exp_str++;
                        break;
                default:
                        eptr->ex_op = OP_LT;
                        break;
                }
                break;
        case '>':
                switch (*expr->exp_str) {
                case '>':
                        eptr->ex_op = OP_SR;
                        expr->exp_str++;
                        break;
                case '=':
                        eptr->ex_op = OP_GE;
                        expr->exp_str++;
                        break;
                default:
                        eptr->ex_op = OP_GT;
                        break;
                }
                break;
        case '=':
                if (*expr->exp_str != '=')
                        eptr->ex_op = OP_STORE;
                else {
                        expr->exp_str++;
                        eptr->ex_op = OP_EQ;
                }
                break;

        case '&':
                if (*expr->exp_str == '&') {
                        expr->exp_str++;
                        eptr->ex_op = OP_LAND;
                } else
                        eptr->ex_op = OP_AND;
                break;

        case '|':
                if (*expr->exp_str == '|') {
                        expr->exp_str++;
                        eptr->ex_op = OP_LOR;
                } else
                        eptr->ex_op = OP_OR;
                break;
        case '$':
                switch (*expr->exp_str++) {
                case 'I':
                case 'i':
                        eptr->ex_type = ET_II;
                        break;
                case 'F':
                case 'f':
                        eptr->ex_type = ET_FI;
                        break;
                case 'S':
                case 's':
                        eptr->ex_type = ET_SI;
                        break;
                case 'V':
                case 'v':
                        if (IS_EXPR_TILDE(expr)) {
                                eptr->ex_type = ET_VI;
                                break;
                        }
                        post("$v? works only for expr~");
                        post("expr: syntax error: %s\n", &expr->exp_str[-2]);
                        return (1);
                case 'X':
                case 'x':
                        if (IS_FEXPR_TILDE(expr)) {
                                eptr->ex_type = ET_XI;
                                if (isdigit((int)(*expr->exp_str)))
                                        break;
                                /* for $x[] is a shorhand for $x1[] */
                                /* eptr->ex_int = 0; */
                                                                eptr->ex_op = 0;
                                                                expr->exp_var[eptr->ex_op].ex_type = eptr->ex_type;
                                goto noinletnum;
                        }
                        post("$x? works only for fexpr~");
                        post("expr: syntax error: %s\n", &expr->exp_str[-2]);
                        return (1);
                case 'y':
                case 'Y':
                        if (IS_FEXPR_TILDE(expr)) {
                                eptr->ex_type = ET_YO;
                                /*$y takes no number */
                                if (isdigit((int)(*expr->exp_str)))
                                        break;
                                /* for $y[] is a shorhand for $y1[] */
                                /* eptr->ex_int = 0; */
                                                                eptr->ex_op = 0;
                                                                expr->exp_var[eptr->ex_op].ex_type = eptr->ex_type;
                                goto noinletnum;
                        }
                        post("$y works only for fexpr~");
                                /* falls through */
                                /*
                                 * allow $# for abstraction argument substitution
                                 *  $1+1 is translated to 0+1 and in abstraction substitution
                                 *  the value is replaced with the new string
                                 */
                                case '0':
                                case '1':
                                case '2':
                                case '3':
                                case '4':
                                case '5':
                                case '6':
                                case '7':
                                case '8':
                                case '9':
                                        p = atoif(--expr->exp_str, &eptr->ex_op, &i);
                        if (!p)
                        return (1);
                                        if (i != ET_INT) {
                                                post("expr: syntax error: %s\n", expr->exp_str);
                                                return (1);
                                        }
                        expr->exp_str = p;
                                        eptr->ex_type = ET_INT;
                                        eptr->ex_int = 0;
                        return (0);
                default:
                        post("expr: syntax error: %s\n", &expr->exp_str[-2]);
                        return (1);
                }
                p = atoif(expr->exp_str, &eptr->ex_op, &i);
                if (!p) {
                        post("expr: syntax error: %s\n", &expr->exp_str[-2]);
                        return (1);
                }
                if (i != ET_INT) {
                        post("expr: syntax error: %s\n", expr->exp_str);
                        return (1);
                }
                /*
                 * make the user inlets one based rather than zero based
                 * therefore we decrement the number that user has supplied
                 */
                if (!eptr->ex_op || (eptr->ex_op)-- > MAX_VARS) {
                 post("expr: syntax error: inlet or outlet out of range: %s\n",
                                                             expr->exp_str);
                        return (1);
                }

                /*
                 * until we can change the input type of inlets on
                 * the fly (at pd_new()
                 * time) the first input to expr~ is always a vector
                 * and $f1 or $i1 is
                 * illegal for fexpr~
                 */
                if (eptr->ex_op == 0 &&
                   (IS_FEXPR_TILDE(expr) ||  IS_EXPR_TILDE(expr)) &&
                   (eptr->ex_type==ET_II || eptr->ex_type==ET_FI ||
                                                        eptr->ex_type==ET_SI)) {
                       post("first inlet of expr~/fexpr~ can only be a vector");
                       return (1);
                }
                /* record the inlet or outlet type and check for consistency */
                if (eptr->ex_type == ET_YO ) {
                        /* it is an outlet  for fexpr~*/
                        /* no need to do anything */
                        ;
                } else if (!expr->exp_var[eptr->ex_op].ex_type)
                        expr->exp_var[eptr->ex_op].ex_type = eptr->ex_type;
                else if (expr->exp_var[eptr->ex_op].ex_type != eptr->ex_type) {
                        post("expr: syntax error: inlets can only have one type: %s\n", expr->exp_str);
                        return (1);
                }
                expr->exp_str = p;
noinletnum:
                break;
        case '"':
                {
                        struct ex_ex ex = { 0 };

                        p = expr->exp_str;
                        if (!*expr->exp_str || *expr->exp_str == '"') {
                                post("expr: syntax error: empty symbol: %s\n", --expr->exp_str);
                                return (1);
                        }
                        if (getoken(expr, &ex))
                                return (1);
                        switch (ex.ex_type) {
                        case ET_STR:
                                if (ex_getsym(ex.ex_ptr, (t_symbol **)&(eptr->ex_ptr))) {
                                        post("expr: syntax error: getoken: problms with ex_getsym\n");
                                        return (1);
                                }
                                eptr->ex_type = ET_SYM;
                                break;
                        case ET_SI:
                                *eptr = ex;
                                eptr->ex_type = ET_VSYM;
                                break;
                        default:
                                post("expr: syntax error: bad symbol name: %s\n", p);
                                return (1);
                        }
                        if (*expr->exp_str++ != '"') {
                                post("expr: syntax error: missing '\"'\n");
                                return (1);
                        }
                        break;
                }
        case '.':
        case '0':
        case '1':
        case '2':
        case '3':
        case '4':
        case '5':
        case '6':
        case '7':
        case '8':
        case '9':
                p = atoif(--expr->exp_str, &eptr->ex_int, &eptr->ex_type);
                if (!p)
                        return (1);
                expr->exp_str = p;
                break;

        default:
                /*
                 * has to be a string, it should either be a
                 * function or a table
                 */
                p = --expr->exp_str;
                for (i = 0; name_ok(*p); i++)
                        p++;
                if (!i) {
                        post("expr: syntax error: %s\n", expr->exp_str);
                        return (1);
                }
                eptr->ex_ptr = (char *)fts_malloc(i + 1);
                strncpy(eptr->ex_ptr, expr->exp_str, (int) i);
                (eptr->ex_ptr)[i] = 0;
                expr->exp_str = p;
                /*
                 * we mark this as a string and later we will change this
                 * to either a function or a table
                 */
                eptr->ex_type = ET_STR;
                break;
        }
        return (0);
}